

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O2

void __thiscall CCNR::ls_solver::build_neighborhood(ls_solver *this)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer plVar3;
  pointer pcVar4;
  pointer plVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  pointer plVar10;
  pointer plVar11;
  int local_64;
  vector<char,_std::allocator<char>_> neighbor_flag;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range2;
  
  std::vector<char,_std::allocator<char>_>::vector
            (&neighbor_flag,(long)this->_additional_len + this->_num_vars,
             (allocator_type *)&local_64);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)neighbor_flag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)neighbor_flag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start); uVar8 = uVar8 + 1) {
    neighbor_flag.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar8] = '\0';
  }
  for (uVar8 = 1; uVar8 <= this->_num_vars; uVar8 = uVar8 + 1) {
    pvVar2 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar1 = pvVar2 + uVar8;
    plVar3 = *(pointer *)
              ((long)&(pvVar1->literals).super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                      _M_impl + 8);
    for (plVar11 = *(pointer *)
                    &(pvVar1->literals).super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                     _M_impl; plVar11 != plVar3; plVar11 = plVar11 + 1) {
      pcVar4 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>.
               _M_impl.super__Vector_impl_data._M_start;
      plVar5 = *(pointer *)
                ((long)&pcVar4[*(int *)plVar11 >> 1].literals.
                        super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
      for (plVar10 = *(pointer *)
                      &pcVar4[*(int *)plVar11 >> 1].literals.
                       super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl;
          plVar10 != plVar5; plVar10 = plVar10 + 1) {
        sVar6 = plVar10->var_num;
        if ((sVar6 != uVar8) &&
           (neighbor_flag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[sVar6] == '\0')) {
          neighbor_flag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[sVar6] = '\x01';
          local_64 = (int)sVar6;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&pvVar1->neighbor_var_nums,&local_64);
        }
      }
    }
    for (uVar9 = 0;
        lVar7 = *(long *)&pvVar2[uVar8].neighbor_var_nums.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data,
        uVar9 < (ulong)((long)*(pointer *)
                               ((long)&pvVar2[uVar8].neighbor_var_nums.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                        lVar7 >> 2); uVar9 = uVar9 + 1) {
      neighbor_flag.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[*(int *)(lVar7 + uVar9 * 4)] = '\0';
    }
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&neighbor_flag.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void ls_solver::build_neighborhood()
{
    size_t j, v;
    int c;
    vector<char> neighbor_flag(_num_vars + _additional_len);
    for (j = 0; j < neighbor_flag.size(); ++j) {
        neighbor_flag[j] = 0;
    }
    for (v = 1; v <= _num_vars; ++v) {
        variable *vp = &(_vars[v]);
        // vector<lit>& vp2=_vars[v].literals;
        for (lit lv : vp->literals) {
            c = lv.clause_num;
            for (lit lc : _clauses[c].literals) {
                if (!neighbor_flag[lc.var_num] && lc.var_num != v) {
                    neighbor_flag[lc.var_num] = 1;
                    vp->neighbor_var_nums.push_back(lc.var_num);
                }
            }
        }
        for (j = 0; j < vp->neighbor_var_nums.size(); ++j) {
            neighbor_flag[vp->neighbor_var_nums[j]] = 0;
        }
    }
}